

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stream_decoder.c
# Opt level: O1

lzma_ret lzma_stream_decoder_init
                   (lzma_next_coder_conflict1 *next,lzma_allocator *allocator,uint64_t memlimit,
                   uint32_t flags)

{
  byte bVar1;
  lzma_coder_conflict1 *plVar2;
  lzma_index_hash *plVar3;
  
  if ((code *)next->init != lzma_stream_decoder_init) {
    lzma_next_end((lzma_next_coder *)next,allocator);
  }
  next->init = (uintptr_t)lzma_stream_decoder_init;
  if (memlimit == 0) {
    return LZMA_PROG_ERROR;
  }
  if (0xf < flags) {
    return LZMA_OPTIONS_ERROR;
  }
  if (next->coder == (lzma_coder_conflict1 *)0x0) {
    plVar2 = (lzma_coder_conflict1 *)lzma_alloc(0x578,allocator);
    next->coder = plVar2;
    if (plVar2 == (lzma_coder_conflict1 *)0x0) {
      return LZMA_MEM_ERROR;
    }
    next->code = stream_decode;
    next->end = stream_decoder_end;
    next->get_check = stream_decoder_get_check;
    next->memconfig = stream_decoder_memconfig;
    (plVar2->block_decoder).memconfig =
         (_func_lzma_ret_lzma_coder_ptr_uint64_t_ptr_uint64_t_ptr_uint64_t_conflict1 *)0x0;
    (plVar2->block_decoder).update =
         (_func_lzma_ret_lzma_coder_ptr_lzma_allocator_ptr_lzma_filter_ptr_lzma_filter_ptr_conflict1
          *)0x0;
    (plVar2->block_decoder).end = (lzma_end_function_conflict1)0x0;
    (plVar2->block_decoder).get_check = (_func_lzma_check_lzma_coder_ptr_conflict1 *)0x0;
    (plVar2->block_decoder).init = 0;
    (plVar2->block_decoder).code = (lzma_code_function_conflict1)0x0;
    (plVar2->block_decoder).coder = (lzma_coder_conflict1 *)0x0;
    (plVar2->block_decoder).id = 0xffffffffffffffff;
    plVar2->index_hash = (lzma_index_hash *)0x0;
  }
  plVar2 = next->coder;
  plVar2->memlimit = memlimit;
  plVar2->memusage = 0x8000;
  bVar1 = (byte)flags;
  plVar2->tell_no_check = (_Bool)(bVar1 & 1);
  plVar2->tell_unsupported_check = (_Bool)(bVar1 >> 1 & 1);
  plVar2->tell_any_check = (_Bool)(bVar1 >> 2 & 1);
  plVar2->concatenated = 7 < flags;
  plVar2->first_stream = true;
  plVar3 = lzma_index_hash_init(plVar2->index_hash,allocator);
  plVar2->index_hash = plVar3;
  if (plVar3 == (lzma_index_hash *)0x0) {
    return LZMA_MEM_ERROR;
  }
  plVar2->sequence = SEQ_INDICATOR;
  plVar2->pos = 0;
  return LZMA_OK;
}

Assistant:

extern lzma_ret
lzma_stream_decoder_init(lzma_next_coder *next, lzma_allocator *allocator,
		uint64_t memlimit, uint32_t flags)
{
	lzma_next_coder_init(&lzma_stream_decoder_init, next, allocator);

	if (memlimit == 0)
		return LZMA_PROG_ERROR;

	if (flags & ~LZMA_SUPPORTED_FLAGS)
		return LZMA_OPTIONS_ERROR;

	if (next->coder == NULL) {
		next->coder = lzma_alloc(sizeof(lzma_coder), allocator);
		if (next->coder == NULL)
			return LZMA_MEM_ERROR;

		next->code = &stream_decode;
		next->end = &stream_decoder_end;
		next->get_check = &stream_decoder_get_check;
		next->memconfig = &stream_decoder_memconfig;

		next->coder->block_decoder = LZMA_NEXT_CODER_INIT;
		next->coder->index_hash = NULL;
	}

	next->coder->memlimit = memlimit;
	next->coder->memusage = LZMA_MEMUSAGE_BASE;
	next->coder->tell_no_check = (flags & LZMA_TELL_NO_CHECK) != 0;
	next->coder->tell_unsupported_check
			= (flags & LZMA_TELL_UNSUPPORTED_CHECK) != 0;
	next->coder->tell_any_check = (flags & LZMA_TELL_ANY_CHECK) != 0;
	next->coder->concatenated = (flags & LZMA_CONCATENATED) != 0;
	next->coder->first_stream = true;

	return stream_decoder_reset(next->coder, allocator);
}